

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O1

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>
               (vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                *container)

{
  pointer ppFVar1;
  FileDescriptorTables *this;
  __normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
  temp;
  pointer ppFVar2;
  
  if (container !=
      (vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
       *)0x0) {
    ppFVar1 = (container->
              super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar2 = (container->
                   super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1;
        ppFVar2 = ppFVar2 + 1) {
      this = *ppFVar2;
      if (this != (FileDescriptorTables *)0x0) {
        FileDescriptorTables::~FileDescriptorTables(this);
        operator_delete(this,0x198);
      }
    }
    ppFVar2 = (container->
              super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      (container->
      super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar2;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}